

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_test.cc
# Opt level: O2

void __thiscall leveldb::crc32c::CRC_StandardResults_Test::TestBody(CRC_StandardResults_Test *this)

{
  int line;
  char cVar1;
  int i;
  long lVar2;
  int i_1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar3;
  AssertHelper local_90;
  AssertionResult gtest_ar_4;
  uint8_t data [48];
  AssertHelper local_40;
  char buf [32];
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_3_ = 0x8a9136;
  local_90.data_._0_4_ = Value(buf,0x20);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)data,"0x8a9136aa","Value(buf, sizeof(buf))",(uint *)&gtest_ar_4,
             (uint *)&local_90);
  if (data[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (data._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)data._8_8_;
    }
    line = 0x11;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(data + 8));
    buf[8] = -1;
    buf[9] = -1;
    buf[10] = -1;
    buf[0xb] = -1;
    buf[0] = -1;
    buf[1] = -1;
    buf[2] = -1;
    buf[3] = -1;
    buf[4] = -1;
    buf[5] = -1;
    buf[6] = -1;
    buf[7] = -1;
    buf[0xc] = -1;
    buf[0xd] = -1;
    buf[0xe] = -1;
    buf[0xf] = -1;
    buf[0x18] = -1;
    buf[0x19] = -1;
    buf[0x1a] = -1;
    buf[0x1b] = -1;
    buf[0x10] = -1;
    buf[0x11] = -1;
    buf[0x12] = -1;
    buf[0x13] = -1;
    buf[0x14] = -1;
    buf[0x15] = -1;
    buf[0x16] = -1;
    buf[0x17] = -1;
    buf[0x1c] = -1;
    buf[0x1d] = -1;
    buf[0x1e] = -1;
    buf[0x1f] = -1;
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_3_ = 0x62a8ab;
    local_90.data_._0_4_ = Value(buf,0x20);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)data,"0x62a8ab43","Value(buf, sizeof(buf))",(int *)&gtest_ar_4,
               (uint *)&local_90);
    if (data[0] == '\0') {
      testing::Message::Message((Message *)&gtest_ar_4);
      if (data._8_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)data._8_8_;
      }
      line = 0x14;
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(data + 8));
      for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
        buf[lVar2] = (char)lVar2;
      }
      gtest_ar_4.success_ = true;
      gtest_ar_4._1_3_ = 0x46dd79;
      local_90.data_._0_4_ = Value(buf,0x20);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)data,"0x46dd794e","Value(buf, sizeof(buf))",(int *)&gtest_ar_4,
                 (uint *)&local_90);
      if (data[0] == '\0') {
        testing::Message::Message((Message *)&gtest_ar_4);
        if (data._8_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)data._8_8_;
        }
        line = 0x19;
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(data + 8));
        cVar1 = '\x1f';
        for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
          buf[lVar2] = cVar1;
          cVar1 = cVar1 + -1;
        }
        gtest_ar_4.success_ = true;
        gtest_ar_4._1_3_ = 0x113fdb;
        local_90.data_._0_4_ = Value(buf,0x20);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)data,"0x113fdb5c","Value(buf, sizeof(buf))",(int *)&gtest_ar_4,
                   (uint *)&local_90);
        if (data[0] != '\0') {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(data + 8));
          data[0x20] = '(';
          data[0x21] = '\0';
          data[0x22] = '\0';
          data[0x23] = '\0';
          data[0x24] = '\0';
          data[0x25] = '\0';
          data[0x26] = '\0';
          data[0x27] = '\0';
          data[0x28] = '\x02';
          data[0x29] = '\0';
          data[0x2a] = '\0';
          data[0x2b] = '\0';
          data[0x2c] = '\0';
          data[0x2d] = '\0';
          data[0x2e] = '\0';
          data[0x2f] = '\0';
          data[0x10] = '\x14';
          data[0x11] = '\0';
          data[0x12] = '\0';
          data[0x13] = '\0';
          data[0x14] = '\0';
          data[0x15] = '\0';
          data[0x16] = '\x04';
          data[0x17] = '\0';
          data[0x18] = '\0';
          data[0x19] = '\0';
          data[0x1a] = '\0';
          data[0x1b] = '\x14';
          data[0x1c] = '\0';
          data[0x1d] = '\0';
          data[0x1e] = '\0';
          data[0x1f] = '\x18';
          data[0] = '\x01';
          data[1] = 0xc0;
          data[2] = '\0';
          data[3] = '\0';
          data[4] = '\0';
          data[5] = '\0';
          data[6] = '\0';
          data[7] = '\0';
          data[8] = '\0';
          data[9] = '\0';
          data[10] = '\0';
          data[0xb] = '\0';
          data[0xc] = '\0';
          data[0xd] = '\0';
          data[0xe] = '\0';
          data[0xf] = '\0';
          local_90.data_._0_4_ = 0xd9963a56;
          local_40.data_._0_4_ = Value((char *)data,0x30);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&gtest_ar_4,"0xd9963a56",
                     "Value(reinterpret_cast<char*>(data), sizeof(data))",(uint *)&local_90,
                     (uint *)&local_40);
          if (gtest_ar_4.success_ == false) {
            testing::Message::Message((Message *)&local_90);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_4.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar_4.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_40,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/crc32c_test.cc"
                       ,0x26,pcVar3);
            testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_40);
            if ((long *)CONCAT44(local_90.data_._4_4_,(uint32_t)local_90.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(uint32_t)local_90.data_) + 8))();
            }
          }
          this_00 = &gtest_ar_4.message_;
          goto LAB_00107736;
        }
        testing::Message::Message((Message *)&gtest_ar_4);
        if (data._8_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)data._8_8_;
        }
        line = 0x1e;
      }
    }
  }
  this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(data + 8);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/crc32c_test.cc"
             ,line,pcVar3);
  testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_4);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if ((long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) + 8))();
  }
LAB_00107736:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

TEST(CRC, StandardResults) {
  // From rfc3720 section B.4.
  char buf[32];

  memset(buf, 0, sizeof(buf));
  ASSERT_EQ(0x8a9136aa, Value(buf, sizeof(buf)));

  memset(buf, 0xff, sizeof(buf));
  ASSERT_EQ(0x62a8ab43, Value(buf, sizeof(buf)));

  for (int i = 0; i < 32; i++) {
    buf[i] = i;
  }
  ASSERT_EQ(0x46dd794e, Value(buf, sizeof(buf)));

  for (int i = 0; i < 32; i++) {
    buf[i] = 31 - i;
  }
  ASSERT_EQ(0x113fdb5c, Value(buf, sizeof(buf)));

  uint8_t data[48] = {
      0x01, 0xc0, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x14, 0x00, 0x00, 0x00, 0x00, 0x00, 0x04, 0x00,
      0x00, 0x00, 0x00, 0x14, 0x00, 0x00, 0x00, 0x18, 0x28, 0x00, 0x00, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
  };
  ASSERT_EQ(0xd9963a56, Value(reinterpret_cast<char*>(data), sizeof(data)));
}